

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O3

void recalculate_stats(int *stats_local_local,wchar_t points_left_local)

{
  uint32_t *puVar1;
  int16_t *piVar2;
  int16_t iVar3;
  player *ppVar4;
  int *piVar5;
  long lVar6;
  
  ppVar4 = player;
  piVar5 = stats;
  lVar6 = 0;
  do {
    iVar3 = (int16_t)*piVar5;
    ppVar4->stat_birth[lVar6] = iVar3;
    ppVar4->stat_max[lVar6] = iVar3;
    ppVar4->stat_cur[lVar6] = iVar3;
    ppVar4->stat_map[lVar6] = (int16_t)lVar6;
    lVar6 = lVar6 + 1;
    piVar5 = piVar5 + 1;
  } while (lVar6 != 5);
  ppVar4->au_birth = (int)stats_local_local * 0x32 + (uint)z_info->start_gold;
  puVar1 = &ppVar4->upkeep->update;
  *puVar1 = *puVar1 | 5;
  update_stuff(ppVar4);
  ppVar4 = player;
  piVar2 = &player->msp;
  player->chp = player->mhp;
  ppVar4->csp = *piVar2;
  event_signal(EVENT_GOLD);
  event_signal(EVENT_AC);
  event_signal(EVENT_HP);
  event_signal(EVENT_STATS);
  return;
}

Assistant:

static void recalculate_stats(int *stats_local_local, int points_left_local)
{
	int i;

	/* Variable stat maxes */
	for (i = 0; i < STAT_MAX; i++) {
		player->stat_cur[i] = player->stat_max[i] =
				player->stat_birth[i] = stats_local_local[i];
		player->stat_map[i] = i;
	}

	/* Gold is inversely proportional to cost */
	player->au_birth = z_info->start_gold + (50 * points_left_local);

	/* Update bonuses, hp, etc. */
	get_bonuses();

	/* Tell the UI about all this stuff that's changed. */
	event_signal(EVENT_GOLD);
	event_signal(EVENT_AC);
	event_signal(EVENT_HP);
	event_signal(EVENT_STATS);
}